

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall
google::protobuf::UnknownFieldSet::MergeFromAndDestroy(UnknownFieldSet *this,UnknownFieldSet *other)

{
  int iVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  reference pvVar3;
  int local_20;
  int i;
  int other_field_count;
  UnknownFieldSet *other_local;
  UnknownFieldSet *this_local;
  
  iVar1 = field_count(other);
  if (0 < iVar1) {
    if (this->fields_ ==
        (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
        0x0) {
      pvVar2 = (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                *)operator_new(0x18);
      memset(pvVar2,0,0x18);
      std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
      vector(pvVar2);
      this->fields_ = pvVar2;
    }
    for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
      pvVar2 = this->fields_;
      pvVar3 = std::
               vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ::operator[](other->fields_,(long)local_20);
      std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
      push_back(pvVar2,pvVar3);
      pvVar3 = std::
               vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ::operator[](other->fields_,(long)local_20);
      UnknownField::Reset(pvVar3);
    }
  }
  pvVar2 = other->fields_;
  if (pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 *)0x0) {
    std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
    ~vector(pvVar2);
    operator_delete(pvVar2,0x18);
  }
  other->fields_ =
       (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
       0x0;
  return;
}

Assistant:

void UnknownFieldSet::MergeFromAndDestroy(UnknownFieldSet* other) {
  int other_field_count = other->field_count();
  if (other_field_count > 0) {
    if (fields_ == NULL) fields_ = new std::vector<UnknownField>();
    for (int i = 0; i < other_field_count; i++) {
      fields_->push_back((*other->fields_)[i]);
      (*other->fields_)[i].Reset();
    }
  }
  delete other->fields_;
  other->fields_ = NULL;
}